

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O0

void ngram_fwdflat_finish(ngram_search_t *ngs)

{
  int frame_idx;
  long lVar1;
  double dVar2;
  double n_speech;
  int32 cf;
  ngram_search_t *ngs_local;
  
  destroy_fwdflat_chan(ngs);
  destroy_fwdflat_wordlist(ngs);
  memset(ngs->word_active,0,(long)(((ngs->base).n_words + 0x1f) / 0x20) << 2);
  frame_idx = ((ngs->base).acmod)->output_frame;
  ngram_search_mark_bptable(ngs,frame_idx);
  ptmr_stop(&ngs->fwdflat_perf);
  if (0 < frame_idx) {
    lVar1 = ps_config_int((ngs->base).config,"frate");
    dVar2 = (double)(frame_idx + 1) / (double)lVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b1,"%8d words recognized (%d/fr)\n",(ulong)(uint)ngs->bpidx,
            (long)(ngs->bpidx + (frame_idx >> 1)) / (long)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b3,"%8d senones evaluated (%d/fr)\n",(ulong)(uint)(ngs->st).n_senone_active_utt,
            (long)((ngs->st).n_senone_active_utt + (frame_idx >> 1)) / (long)(frame_idx + 1) &
            0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b5,"%8d channels searched (%d/fr)\n",(ulong)(uint)(ngs->st).n_fwdflat_chan,
            (long)(ngs->st).n_fwdflat_chan / (long)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b7,"%8d words searched (%d/fr)\n",(ulong)(uint)(ngs->st).n_fwdflat_words,
            (long)(ngs->st).n_fwdflat_words / (long)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3ba,"%8d word transitions (%d/fr)\n",(ulong)(uint)(ngs->st).n_fwdflat_word_transition
            ,(long)(ngs->st).n_fwdflat_word_transition / (long)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3bd,"fwdflat %.2f CPU %.3f xRT\n",(ngs->fwdflat_perf).t_cpu,
            (double)(ngs->fwdflat_perf).t_cpu / dVar2);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3c0,"fwdflat %.2f wall %.3f xRT\n",(ngs->fwdflat_perf).t_elapsed,
            (double)(ngs->fwdflat_perf).t_elapsed / dVar2);
  }
  return;
}

Assistant:

void
ngram_fwdflat_finish(ngram_search_t *ngs)
{
    int32 cf;

    destroy_fwdflat_chan(ngs);
    destroy_fwdflat_wordlist(ngs);
    bitvec_clear_all(ngs->word_active, ps_search_n_words(ngs));

    /* This is the number of frames processed. */
    cf = ps_search_acmod(ngs)->output_frame;
    /* Add a mark in the backpointer table for one past the final frame. */
    ngram_search_mark_bptable(ngs, cf);

    ptmr_stop(&ngs->fwdflat_perf);
    /* Print out some statistics. */
    if (cf > 0) {
        double n_speech = (double)(cf + 1)
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("%8d words recognized (%d/fr)\n",
               ngs->bpidx, (ngs->bpidx + (cf >> 1)) / (cf + 1));
        E_INFO("%8d senones evaluated (%d/fr)\n", ngs->st.n_senone_active_utt,
               (ngs->st.n_senone_active_utt + (cf >> 1)) / (cf + 1));
        E_INFO("%8d channels searched (%d/fr)\n",
               ngs->st.n_fwdflat_chan, ngs->st.n_fwdflat_chan / (cf + 1));
        E_INFO("%8d words searched (%d/fr)\n",
               ngs->st.n_fwdflat_words, ngs->st.n_fwdflat_words / (cf + 1));
        E_INFO("%8d word transitions (%d/fr)\n",
               ngs->st.n_fwdflat_word_transition,
               ngs->st.n_fwdflat_word_transition / (cf + 1));
        E_INFO("fwdflat %.2f CPU %.3f xRT\n",
               ngs->fwdflat_perf.t_cpu,
               ngs->fwdflat_perf.t_cpu / n_speech);
        E_INFO("fwdflat %.2f wall %.3f xRT\n",
               ngs->fwdflat_perf.t_elapsed,
               ngs->fwdflat_perf.t_elapsed / n_speech);
    }
}